

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

container_t *
container_and(container_t *c1,uint8_t type1,container_t *c2,uint8_t type2,uint8_t *result_type)

{
  _Bool _Var1;
  array_container_t *paVar2;
  array_container_t *paVar3;
  uint uVar4;
  undefined7 in_register_00000031;
  container_t *result;
  array_container_t *local_30;
  
  uVar4 = (uint)CONCAT71(in_register_00000031,type1);
  if (uVar4 == 4) {
    uVar4 = (uint)*(byte *)((long)c1 + 8);
    if (*(byte *)((long)c1 + 8) == 4) goto LAB_0010a83a;
    c1 = *c1;
  }
  if (type2 == '\x04') {
    type2 = *(byte *)((long)c2 + 8);
    if (type2 == 4) {
LAB_0010a83a:
      __assert_fail("*type != SHARED_CONTAINER_TYPE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1062,
                    "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
    }
    c2 = *c2;
  }
  local_30 = (array_container_t *)0x0;
  switch((uint)type2 + (uVar4 & 0xff) * 4) {
  case 5:
    _Var1 = bitset_bitset_container_intersection
                      ((bitset_container_t *)c1,(bitset_container_t *)c2,&local_30);
    goto LAB_0010a769;
  case 6:
    paVar2 = (array_container_t *)malloc(0x10);
    if (paVar2 == (array_container_t *)0x0) {
      paVar2 = (array_container_t *)0x0;
    }
    else {
      paVar2->cardinality = 0;
      paVar2->capacity = 0;
      paVar2->array = (uint16_t *)0x0;
    }
    local_30 = paVar2;
    array_bitset_container_intersection((array_container_t *)c2,(bitset_container_t *)c1,paVar2);
    goto LAB_0010a826;
  case 7:
    paVar2 = (array_container_t *)c1;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x1334,
                  "container_t *container_and(const container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                 );
  case 9:
    paVar2 = (array_container_t *)malloc(0x10);
    if (paVar2 == (array_container_t *)0x0) {
      paVar2 = (array_container_t *)0x0;
    }
    else {
      paVar2->cardinality = 0;
      paVar2->capacity = 0;
      paVar2->array = (uint16_t *)0x0;
    }
    *result_type = '\x02';
    local_30 = paVar2;
    array_bitset_container_intersection((array_container_t *)c1,(bitset_container_t *)c2,paVar2);
    return paVar2;
  case 10:
    paVar2 = (array_container_t *)malloc(0x10);
    if (paVar2 == (array_container_t *)0x0) {
      paVar2 = (array_container_t *)0x0;
    }
    else {
      paVar2->cardinality = 0;
      paVar2->capacity = 0;
      paVar2->array = (uint16_t *)0x0;
    }
    local_30 = paVar2;
    array_container_intersection((array_container_t *)c1,(array_container_t *)c2,paVar2);
LAB_0010a826:
    *result_type = '\x02';
    return paVar2;
  case 0xb:
    paVar2 = (array_container_t *)malloc(0x10);
    if (paVar2 == (array_container_t *)0x0) {
      paVar2 = (array_container_t *)0x0;
    }
    else {
      paVar2->cardinality = 0;
      paVar2->capacity = 0;
      paVar2->array = (uint16_t *)0x0;
    }
    *result_type = '\x02';
    paVar3 = (array_container_t *)c2;
    goto LAB_0010a7eb;
  case 0xd:
    paVar2 = (array_container_t *)c2;
    c2 = c1;
    break;
  case 0xe:
    paVar2 = (array_container_t *)malloc(0x10);
    if (paVar2 == (array_container_t *)0x0) {
      paVar2 = (array_container_t *)0x0;
    }
    else {
      paVar2->cardinality = 0;
      paVar2->capacity = 0;
      paVar2->array = (uint16_t *)0x0;
    }
    *result_type = '\x02';
    paVar3 = (array_container_t *)c1;
    c1 = c2;
LAB_0010a7eb:
    local_30 = paVar2;
    array_run_container_intersection((array_container_t *)c1,(run_container_t *)paVar3,paVar2);
    return paVar2;
  case 0xf:
    paVar2 = (array_container_t *)malloc(0x10);
    if (paVar2 == (array_container_t *)0x0) {
      paVar2 = (array_container_t *)0x0;
    }
    else {
      paVar2->cardinality = 0;
      paVar2->capacity = 0;
      paVar2->array = (uint16_t *)0x0;
    }
    local_30 = paVar2;
    run_container_intersection
              ((run_container_t *)c1,(run_container_t *)c2,(run_container_t *)paVar2);
    paVar3 = (array_container_t *)
             convert_run_to_efficient_container((run_container_t *)paVar2,result_type);
    if (paVar3 == paVar2) {
      return paVar3;
    }
    run_container_free((run_container_t *)paVar2);
    return paVar3;
  }
  _Var1 = run_bitset_container_intersection
                    ((run_container_t *)c2,(bitset_container_t *)paVar2,&local_30);
LAB_0010a769:
  *result_type = '\x02' - _Var1;
  return local_30;
}

Assistant:

static inline container_t *container_and(
    const container_t *c1, uint8_t type1,
    const container_t *c2, uint8_t type2,
    uint8_t *result_type
){
    c1 = container_unwrap_shared(c1, &type1);
    c2 = container_unwrap_shared(c2, &type2);
    container_t *result = NULL;
    switch (PAIR_CONTAINER_TYPES(type1, type2)) {
        case CONTAINER_PAIR(BITSET,BITSET):
            *result_type = bitset_bitset_container_intersection(
                                const_CAST_bitset(c1),
                                const_CAST_bitset(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,ARRAY):
            result = array_container_create();
            array_container_intersection(const_CAST_array(c1),
                                         const_CAST_array(c2),
                                         CAST_array(result));
            *result_type = ARRAY_CONTAINER_TYPE;  // never bitset
            return result;

        case CONTAINER_PAIR(RUN,RUN):
            result = run_container_create();
            run_container_intersection(const_CAST_run(c1),
                                       const_CAST_run(c2),
                                       CAST_run(result));
            return convert_run_to_efficient_container_and_free(
                        CAST_run(result), result_type);

        case CONTAINER_PAIR(BITSET,ARRAY):
            result = array_container_create();
            array_bitset_container_intersection(const_CAST_array(c2),
                                                const_CAST_bitset(c1),
                                                CAST_array(result));
            *result_type = ARRAY_CONTAINER_TYPE;  // never bitset
            return result;

        case CONTAINER_PAIR(ARRAY,BITSET):
            result = array_container_create();
            *result_type = ARRAY_CONTAINER_TYPE;  // never bitset
            array_bitset_container_intersection(const_CAST_array(c1),
                                                const_CAST_bitset(c2),
                                                CAST_array(result));
            return result;

        case CONTAINER_PAIR(BITSET,RUN):
            *result_type = run_bitset_container_intersection(
                                const_CAST_run(c2),
                                const_CAST_bitset(c1), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(RUN,BITSET):
            *result_type = run_bitset_container_intersection(
                                const_CAST_run(c1),
                                const_CAST_bitset(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,RUN):
            result = array_container_create();
            *result_type = ARRAY_CONTAINER_TYPE;  // never bitset
            array_run_container_intersection(const_CAST_array(c1),
                                             const_CAST_run(c2),
                                             CAST_array(result));
            return result;

        case CONTAINER_PAIR(RUN,ARRAY):
            result = array_container_create();
            *result_type = ARRAY_CONTAINER_TYPE;  // never bitset
            array_run_container_intersection(const_CAST_array(c2),
                                             const_CAST_run(c1),
                                             CAST_array(result));
            return result;

        default:
            assert(false);
            __builtin_unreachable();
            return NULL;
    }
}